

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

exr_result_t validate_part_type(exr_context_t f,exr_priv_part_t curpart)

{
  exr_attr_string_t *s;
  char *__s1;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  exr_result_t eVar4;
  exr_attribute_t *peVar5;
  char *pcVar6;
  
  peVar5 = curpart->type;
  if (peVar5 == (exr_attribute_t *)0x0) goto LAB_00134cb1;
  if (f->is_singlepart_tiled == '\0') {
LAB_00134bf9:
    switch(curpart->storage_mode) {
    case EXR_STORAGE_SCANLINE:
      pcVar6 = "scanlineimage";
      break;
    case EXR_STORAGE_TILED:
      pcVar6 = "tiledimage";
      break;
    case EXR_STORAGE_DEEP_SCANLINE:
      pcVar6 = "deepscanline";
      break;
    case EXR_STORAGE_DEEP_TILED:
      pcVar6 = "deeptile";
      break;
    default:
      bVar1 = true;
      pcVar6 = (char *)0x0;
      goto LAB_00134c37;
    }
    bVar1 = false;
LAB_00134c37:
    bVar2 = true;
    if (!bVar1) {
      s = (peVar5->field_6).string;
      __s1 = s->str;
      uVar3 = strcmp(__s1,pcVar6);
      peVar5 = (exr_attribute_t *)(ulong)uVar3;
      if (uVar3 != 0) {
        if (f->mode == '\x01') {
          peVar5 = (exr_attribute_t *)0xe;
          bVar2 = false;
        }
        else if (f->strict_header == '\0') {
          uVar3 = exr_attr_string_set(f,s,pcVar6);
          peVar5 = (exr_attribute_t *)(ulong)uVar3;
          if (uVar3 != 0) {
            pcVar6 = 
            "attribute \'type\': Mismatch between file flags and type attribute, unable to fix";
            goto LAB_00134bc7;
          }
        }
        else {
          bVar2 = false;
          uVar3 = (*f->print_error)(f,0xe,
                                    "attribute \'type\': Type should be \'%s\' but set to \'%s\', believing file flags"
                                    ,pcVar6,__s1);
          peVar5 = (exr_attribute_t *)(ulong)uVar3;
        }
      }
    }
  }
  else {
    if ((f->is_multipart == '\0') && (f->num_parts < 2)) {
      if ((curpart->storage_mode == EXR_STORAGE_TILED) ||
         (curpart->storage_mode = EXR_STORAGE_TILED, f->strict_header == '\0')) goto LAB_00134bf9;
      pcVar6 = "attribute \'type\': Single part tiled flag set but not marked as tiled storage type"
      ;
    }
    else {
      pcVar6 = "Multipart files cannot have the tiled bit set";
    }
LAB_00134bc7:
    bVar2 = false;
    uVar3 = (*f->print_error)(f,0xe,pcVar6);
    peVar5 = (exr_attribute_t *)(ulong)uVar3;
  }
  if (!bVar2) {
    return (exr_result_t)peVar5;
  }
LAB_00134cb1:
  if (curpart->storage_mode != EXR_STORAGE_LAST_TYPE) {
    return 0;
  }
  eVar4 = (*f->print_error)(f,0xe,"Unable to determine data storage type for part",f->print_error);
  return eVar4;
}

Assistant:

static exr_result_t
validate_part_type (exr_context_t f, exr_priv_part_t curpart)
{
    // TODO: there are probably more tests to add here...
    if (curpart->type)
    {
        const char *expectedtype = NULL;
        exr_result_t rv;

        // see if the type overwrote the storage mode
        if (f->is_singlepart_tiled)
        {
            if (f->is_multipart || f->num_parts > 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "Multipart files cannot have the tiled bit set");

            if (curpart->storage_mode != EXR_STORAGE_TILED)
            {
                curpart->storage_mode = EXR_STORAGE_TILED;

                if (f->strict_header)
                {
                    return f->print_error (
                        f,
                        EXR_ERR_INVALID_ATTR,
                        "attribute 'type': Single part tiled flag set but not marked as tiled storage type");
                }
            }
        }

        if (curpart->storage_mode == EXR_STORAGE_SCANLINE)
            expectedtype = "scanlineimage";
        else if (curpart->storage_mode == EXR_STORAGE_TILED)
            expectedtype = "tiledimage";
        else if (curpart->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
            expectedtype = "deepscanline";
        else if (curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
            expectedtype = "deeptile";

        if (expectedtype && 0 != strcmp (curpart->type->string->str, expectedtype))
        {
            if (f->mode == EXR_CONTEXT_WRITE) return EXR_ERR_INVALID_ATTR;

            if (f->strict_header)
            {
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "attribute 'type': Type should be '%s' but set to '%s', believing file flags",
                    expectedtype,
                    curpart->type->string->str);
            }
            else
            {
                /* C++ silently changed this */
                rv = exr_attr_string_set (
                    f, curpart->type->string, expectedtype);

                if (rv != EXR_ERR_SUCCESS)
                    return f->print_error (
                        f,
                        EXR_ERR_INVALID_ATTR,
                        "attribute 'type': Mismatch between file flags and type attribute, unable to fix");
            }
        }
    }

    /* NB: we allow an 'unknown' storage type of EXR_STORAGE_UNKNOWN
     * for future proofing */
    if (curpart->storage_mode == EXR_STORAGE_LAST_TYPE)
    {
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Unable to determine data storage type for part");
    }

    return EXR_ERR_SUCCESS;
}